

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

void __thiscall
cmBinUtilsMacOSMachOLinker::cmBinUtilsMacOSMachOLinker
          (cmBinUtilsMacOSMachOLinker *this,cmRuntimeDependencyArchive *archive)

{
  cmBinUtilsLinker::cmBinUtilsLinker(&this->super_cmBinUtilsLinker,archive);
  (this->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker =
       (_func_int **)&PTR__cmBinUtilsMacOSMachOLinker_007a7ec8;
  (this->Tool)._M_t.
  super___uniq_ptr_impl<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
  .super__Head_base<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_false>._M_head_impl =
       (cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *)0x0;
  (this->ScannedFileInfo)._M_h._M_buckets = &(this->ScannedFileInfo)._M_h._M_single_bucket;
  (this->ScannedFileInfo)._M_h._M_bucket_count = 1;
  (this->ScannedFileInfo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ScannedFileInfo)._M_h._M_element_count = 0;
  (this->ScannedFileInfo)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ScannedFileInfo)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ScannedFileInfo)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

cmBinUtilsMacOSMachOLinker::cmBinUtilsMacOSMachOLinker(
  cmRuntimeDependencyArchive* archive)
  : cmBinUtilsLinker(archive)
{
}